

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::SubtractPropagateStatistics::Operation<short,duckdb::TrySubtractOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  short sVar1;
  short sVar2;
  long value;
  int iVar3;
  short sVar4;
  int64_t iVar5;
  Value local_70;
  
  sVar1 = NumericStats::GetMin<short>(lstats);
  sVar2 = NumericStats::GetMax<short>(rstats);
  iVar3 = (int)sVar1 - (int)sVar2;
  iVar5 = 1;
  if ((short)iVar3 == iVar3) {
    sVar1 = NumericStats::GetMax<short>(lstats);
    sVar2 = NumericStats::GetMin<short>(rstats);
    sVar4 = (short)((int)sVar1 - (int)sVar2);
    if ((int)sVar4 == (int)sVar1 - (int)sVar2) {
      iVar5 = 0;
      value = (long)(short)iVar3;
      if (0xffff < iVar3 + 0x8000U) {
        value = iVar5;
      }
      Value::Numeric(&local_70,type,value);
      Value::operator=(new_min,&local_70);
      Value::~Value(&local_70);
      Value::Numeric(&local_70,type,(long)sVar4);
      Value::operator=(new_max,&local_70);
      Value::~Value(&local_70);
    }
  }
  return SUB81(iVar5,0);
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(rstats), min)) {
			return true;
		}
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMin<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}